

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryIndexedTree.hpp
# Opt level: O2

void __thiscall primesum::BinaryIndexedTree::update(BinaryIndexedTree *this,int64_t n,int64_t low)

{
  ulong *puVar1;
  long *plVar2;
  ulong uVar3;
  pointer p_Var4;
  long lVar5;
  ulong uVar6;
  
  uVar6 = n - low >> 1;
  p_Var4 = (this->tree_).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = this->size_;
  do {
    puVar1 = (ulong *)(p_Var4 + uVar6);
    uVar3 = *puVar1;
    *puVar1 = *puVar1 - n;
    plVar2 = (long *)((long)p_Var4 + uVar6 * 0x10 + 8);
    *plVar2 = (*plVar2 - (n >> 0x3f)) - (ulong)(uVar3 < (ulong)n);
    uVar6 = uVar6 | uVar6 + 1;
  } while ((long)uVar6 < lVar5);
  return;
}

Assistant:

void update(int64_t n, int64_t low)
  {
    int64_t pos = n - low;
    pos >>= 1;
    do {
      tree_[pos] -= n;
      pos |= pos + 1;
    }
    while (pos < size_);
  }